

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O0

void __thiscall helics::tcp::TcpComms::setFlag(TcpComms *this,string_view flag,bool val)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string_view flag_00;
  byte bVar1;
  bool bVar2;
  byte in_CL;
  size_t in_RDX;
  char *in_RSI;
  size_t in_RDI;
  CommsInterface *in_stack_ffffffffffffff90;
  CommsInterface *in_stack_ffffffffffffff98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  size_t sVar3;
  undefined1 val_00;
  undefined7 in_stack_ffffffffffffffe0;
  size_t sVar4;
  char *pcVar5;
  
  bVar1 = in_CL & 1;
  sVar3 = in_RDX;
  sVar4 = in_RDI;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  val_00 = (undefined1)(sVar3 >> 0x38);
  __x._M_str = in_stack_ffffffffffffffc0;
  __x._M_len = in_stack_ffffffffffffffb8;
  __y._M_str = in_stack_ffffffffffffffb0;
  __y._M_len = in_stack_ffffffffffffffa8;
  bVar2 = std::operator==(__x,__y);
  if (bVar2) {
    bVar2 = CommsInterface::propertyLock(in_stack_ffffffffffffff98);
    if (bVar2) {
      *(byte *)(in_RDI + 0x4c0) = bVar1 & 1;
      CommsInterface::propertyUnLock(in_stack_ffffffffffffff90);
    }
  }
  else {
    pcVar5 = in_RSI;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
    __x_00._M_str = in_stack_ffffffffffffffc0;
    __x_00._M_len = in_RDX;
    __y_00._M_str = in_RSI;
    __y_00._M_len = in_stack_ffffffffffffffa8;
    bVar2 = std::operator==(__x_00,__y_00);
    if (bVar2) {
      bVar2 = CommsInterface::propertyLock(in_stack_ffffffffffffff98);
      if (bVar2) {
        *(byte *)(in_RDI + 0x41c) = bVar1 & 1;
        CommsInterface::propertyUnLock(in_stack_ffffffffffffff90);
      }
    }
    else {
      flag_00._M_str = pcVar5;
      flag_00._M_len = sVar4;
      NetworkCommsInterface::setFlag
                ((NetworkCommsInterface *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),flag_00,
                 (bool)val_00);
    }
  }
  return;
}

Assistant:

void TcpComms::setFlag(std::string_view flag, bool val)
{
    if (flag == "reuse_address") {
        if (propertyLock()) {
            reuse_address = val;
            propertyUnLock();
        }
    } else if (flag == "encrypted") {
        if (propertyLock()) {
            encrypted = val;
            propertyUnLock();
        }
    } else {
        NetworkCommsInterface::setFlag(flag, val);
    }
}